

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O0

void Luv24toLuv48(LogLuvState *sp,uint8_t *op,tmsize_t n)

{
  int iVar1;
  undefined2 *puVar2;
  double local_40;
  double v;
  double u;
  int16_t *luv3;
  uint32_t *luv;
  tmsize_t n_local;
  uint8_t *op_local;
  LogLuvState *sp_local;
  
  luv3 = (int16_t *)sp->tbuf;
  u = (double)op;
  luv = (uint32_t *)n;
  n_local = (tmsize_t)op;
  op_local = (uint8_t *)sp;
  while (0 < (long)luv) {
    *(ushort *)u = ((ushort)(*(uint *)luv3 >> 0xc) & 0xffd) + 0x3402;
    u = (double)((long)u + 2);
    luv = (uint32_t *)((long)luv + -1);
    iVar1 = uv_decode(&v,&local_40,*(uint *)luv3 & 0x3fff);
    if (iVar1 < 0) {
      v = 0.210526316;
      local_40 = 0.473684211;
    }
    puVar2 = (undefined2 *)((long)u + 2);
    *(short *)u = (short)(int)(v * 32768.0);
    u = (double)((long)u + 4);
    *puVar2 = (short)(int)(local_40 * 32768.0);
    luv3 = luv3 + 2;
  }
  return;
}

Assistant:

static void Luv24toLuv48(LogLuvState *sp, uint8_t *op, tmsize_t n)
{
    uint32_t *luv = (uint32_t *)sp->tbuf;
    int16_t *luv3 = (int16_t *)op;

    while (n-- > 0)
    {
        double u, v;

        *luv3++ = (int16_t)((*luv >> 12 & 0xffd) + 13314);
        if (uv_decode(&u, &v, *luv & 0x3fff) < 0)
        {
            u = U_NEU;
            v = V_NEU;
        }
        *luv3++ = (int16_t)(u * (1L << 15));
        *luv3++ = (int16_t)(v * (1L << 15));
        luv++;
    }
}